

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::AddStores::anon_class_24_3_d157440e::operator()
          (anon_class_24_3_d157440e *this,Instruction *user)

{
  AggressiveDCEPass *this_00;
  Op OVar1;
  uint32_t uVar2;
  IRContext *this_01;
  BasicBlock *this_02;
  Function *pFVar3;
  uint32_t kStoreTargetAddrInIdx;
  BasicBlock *blk;
  Instruction *user_local;
  anon_class_24_3_d157440e *this_local;
  
  this_00 = this->this;
  this_01 = Pass::context((Pass *)this_00);
  this_02 = IRContext::get_instr_block(this_01,user);
  if ((this_02 == (BasicBlock *)0x0) ||
     (pFVar3 = BasicBlock::GetParent(this_02), pFVar3 == this->func)) {
    OVar1 = opt::Instruction::opcode(user);
    switch(OVar1) {
    case OpLoad:
      break;
    case OpStore:
      uVar2 = opt::Instruction::GetSingleWordInOperand(user,0);
      if (uVar2 == this->ptrId) {
        AddToWorklist(this_00,user);
      }
      break;
    case OpCopyMemory:
    case OpCopyMemorySized:
      uVar2 = opt::Instruction::GetSingleWordInOperand(user,0);
      if (uVar2 == this->ptrId) {
        AddToWorklist(this_00,user);
      }
      break;
    case OpAccessChain:
    case OpInBoundsAccessChain:
    case OpCopyObject:
      pFVar3 = this->func;
      uVar2 = opt::Instruction::result_id(user);
      AddStores(this_00,pFVar3,uVar2);
      break;
    default:
      AddToWorklist(this_00,user);
    }
  }
  return;
}

Assistant:

void AggressiveDCEPass::AddStores(Function* func, uint32_t ptrId) {
  get_def_use_mgr()->ForEachUser(ptrId, [this, ptrId, func](Instruction* user) {
    // If the user is not a part of |func|, skip it.
    BasicBlock* blk = context()->get_instr_block(user);
    if (blk && blk->GetParent() != func) return;

    switch (user->opcode()) {
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain:
      case spv::Op::OpCopyObject:
        this->AddStores(func, user->result_id());
        break;
      case spv::Op::OpLoad:
        break;
      case spv::Op::OpCopyMemory:
      case spv::Op::OpCopyMemorySized:
        if (user->GetSingleWordInOperand(kCopyMemoryTargetAddrInIdx) == ptrId) {
          AddToWorklist(user);
        }
        break;
      // If default, assume it stores e.g. frexp, modf, function call
      case spv::Op::OpStore: {
        const uint32_t kStoreTargetAddrInIdx = 0;
        if (user->GetSingleWordInOperand(kStoreTargetAddrInIdx) == ptrId)
          AddToWorklist(user);
        break;
      }
      default:
        AddToWorklist(user);
        break;
    }
  });
}